

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O2

bool __thiscall PsxRelocator::relocate(PsxRelocator *this,int *memoryAddress)

{
  int iVar1;
  pointer pPVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  PsxRelocatorFile *file;
  pointer file_00;
  
  uVar4 = getCrc32((this->outputData).data_,(this->outputData).size_);
  (this->outputData).size_ = 0;
  this->dataChanged = false;
  iVar1 = *memoryAddress;
  pPVar2 = (this->files).super__Vector_base<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = 0;
  for (file_00 = (this->files).
                 super__Vector_base<PsxRelocatorFile,_std::allocator<PsxRelocatorFile>_>._M_impl.
                 super__Vector_impl_data._M_start; file_00 != pPVar2; file_00 = file_00 + 1) {
    bVar3 = relocateFile(this,file_00,memoryAddress);
    bVar6 = bVar6 | !bVar3;
  }
  uVar5 = getCrc32((this->outputData).data_,(this->outputData).size_);
  if (uVar4 != uVar5) {
    this->dataChanged = true;
  }
  *memoryAddress = *memoryAddress - iVar1;
  return (bool)(~bVar6 & 1);
}

Assistant:

bool PsxRelocator::relocate(int& memoryAddress)
{
	int oldCrc = getCrc32(outputData.data(),outputData.size());
	outputData.clear();
	dataChanged = false;

	bool error = false;
	int start = memoryAddress;

	for (PsxRelocatorFile& file: files)
	{
		if (!relocateFile(file,memoryAddress))
			error = true;
	}
	
	int newCrc = getCrc32(outputData.data(),outputData.size());
	if (oldCrc != newCrc)
		dataChanged = true;

	memoryAddress -= start;
	return !error;
}